

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O2

void __thiscall chrono::fea::ChNodeFEAcurv::SetNoSpeedNoAcceleration(ChNodeFEAcurv *this)

{
  double dVar1;
  
  dVar1 = DAT_011dd3e0;
  if (this != (ChNodeFEAcurv *)Q_FLIP_AROUND_X) {
    (this->m_rxx_dt).m_data[0] = VNULL;
    (this->m_rxx_dt).m_data[1] = dVar1;
    (this->m_rxx_dt).m_data[2] = DAT_011dd3e8;
  }
  dVar1 = DAT_011dd3e0;
  if (this != (ChNodeFEAcurv *)(Q_ROTATE_Z_TO_X + 8)) {
    (this->m_ryy_dt).m_data[0] = VNULL;
    (this->m_ryy_dt).m_data[1] = dVar1;
    (this->m_ryy_dt).m_data[2] = DAT_011dd3e8;
  }
  dVar1 = DAT_011dd3e0;
  if (this != (ChNodeFEAcurv *)(Q_ROTATE_Z_TO_Y + 0x10)) {
    (this->m_rzz_dt).m_data[0] = VNULL;
    (this->m_rzz_dt).m_data[1] = dVar1;
    (this->m_rzz_dt).m_data[2] = DAT_011dd3e8;
  }
  dVar1 = DAT_011dd3e0;
  if (this != (ChNodeFEAcurv *)(Q_ROTATE_X_TO_Z + 0x18)) {
    (this->m_rxx_dtdt).m_data[0] = VNULL;
    (this->m_rxx_dtdt).m_data[1] = dVar1;
    (this->m_rxx_dtdt).m_data[2] = DAT_011dd3e8;
  }
  dVar1 = DAT_011dd3e0;
  if (this != (ChNodeFEAcurv *)Q_ROTATE_X_TO_Z) {
    (this->m_ryy_dtdt).m_data[0] = VNULL;
    (this->m_ryy_dtdt).m_data[1] = dVar1;
    (this->m_ryy_dtdt).m_data[2] = DAT_011dd3e8;
  }
  dVar1 = DAT_011dd3e0;
  if (this != (ChNodeFEAcurv *)&DAT_011dd2f8) {
    (this->m_rzz_dtdt).m_data[0] = VNULL;
    (this->m_rzz_dtdt).m_data[1] = dVar1;
    (this->m_rzz_dtdt).m_data[2] = DAT_011dd3e8;
  }
  return;
}

Assistant:

void ChNodeFEAcurv::SetNoSpeedNoAcceleration() {
    m_rxx_dt = VNULL;
    m_ryy_dt = VNULL;
    m_rzz_dt = VNULL;
    m_rxx_dtdt = VNULL;
    m_ryy_dtdt = VNULL;
    m_rzz_dtdt = VNULL;
}